

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSToken.cpp
# Opt level: O0

bool __thiscall OSToken::setSOPIN(OSToken *this,ByteString *soPINBlob)

{
  byte bVar1;
  long *in_RDI;
  CK_ULONG flags;
  OSAttribute soPIN;
  undefined6 in_stack_ffffffffffffff10;
  byte in_stack_ffffffffffffff16;
  byte in_stack_ffffffffffffff17;
  ByteString *in_stack_ffffffffffffff38;
  undefined2 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff42;
  undefined5 in_stack_ffffffffffffff43;
  undefined1 local_b8 [183];
  byte local_1;
  
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    local_1 = 0;
  }
  else {
    OSAttribute::OSAttribute
              ((OSAttribute *)
               CONCAT53(in_stack_ffffffffffffff43,
                        CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40)),
               in_stack_ffffffffffffff38);
    bVar1 = (**(code **)(*(long *)in_RDI[0x18] + 0x40))((long *)in_RDI[0x18],0x8000534c,local_b8);
    if (((bVar1 & 1) == 0) ||
       (in_stack_ffffffffffffff17 = (**(code **)(*in_RDI + 0x20))(in_RDI,&stack0xffffffffffffff40),
       (in_stack_ffffffffffffff17 & 1) == 0)) {
      local_1 = 0;
    }
    else {
      in_stack_ffffffffffffff16 =
           (**(code **)(*in_RDI + 0x28))
                     (in_RDI,CONCAT53(in_stack_ffffffffffffff43,
                                      CONCAT12(in_stack_ffffffffffffff42,in_stack_ffffffffffffff40))
                             & 0xffffffffff0fffff);
      local_1 = in_stack_ffffffffffffff16 & 1;
    }
    OSAttribute::~OSAttribute
              ((OSAttribute *)
               CONCAT17(in_stack_ffffffffffffff17,
                        CONCAT16(in_stack_ffffffffffffff16,in_stack_ffffffffffffff10)));
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSToken::setSOPIN(const ByteString& soPINBlob)
{
	if (!valid) return false;

	OSAttribute soPIN(soPINBlob);

	CK_ULONG flags;

	if (tokenObject->setAttribute(CKA_OS_SOPIN, soPIN) &&
	    getTokenFlags(flags))
	{
		flags &= ~CKF_SO_PIN_COUNT_LOW;
		flags &= ~CKF_SO_PIN_FINAL_TRY;
		flags &= ~CKF_SO_PIN_LOCKED;
		flags &= ~CKF_SO_PIN_TO_BE_CHANGED;

		return setTokenFlags(flags);
	}

	return false;
}